

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O1

bool __thiscall TestRegistry::endOfGroup(TestRegistry *this,UtestShell *test)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 local_30 [16];
  
  bVar2 = true;
  if (test != (UtestShell *)0x0) {
    iVar3 = (*test->_vptr_UtestShell[3])(test);
    if (CONCAT44(extraout_var,iVar3) != 0) {
      UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffe0);
      (*test->_vptr_UtestShell[3])(test);
      UtestShell::getGroup((UtestShell *)local_30);
      bVar2 = operator!=((SimpleString *)&stack0xffffffffffffffe0,(SimpleString *)local_30);
      bVar1 = true;
      goto LAB_00136cab;
    }
  }
  bVar1 = false;
LAB_00136cab:
  if (bVar1) {
    SimpleString::~SimpleString((SimpleString *)local_30);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffe0);
  }
  return bVar2;
}

Assistant:

bool TestRegistry::endOfGroup(UtestShell* test)
{
    return (!test || !test->getNext() || test->getGroup() != test->getNext()->getGroup());
}